

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O3

void initAndReadFile(MultiPartInputFile *in,
                    vector<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_> *outHeaders,int part,
                    vector<partData,_std::allocator<partData>_> *parts,fileMetrics *metrics,
                    bool reread)

{
  pointer ppVar1;
  pointer ppVar2;
  ulong uVar3;
  size_type __n;
  int iVar4;
  long *plVar5;
  int iVar6;
  long lVar7;
  undefined8 uVar8;
  _Alloc_hider _Var9;
  long lVar10;
  long lVar11;
  ulong uVar12;
  DeepTiledInputPart inpart;
  undefined1 local_178 [40];
  _Alloc_hider local_150;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  string type;
  partSizeData local_108;
  partSizeData local_c0;
  partSizeData local_78;
  
  if ((parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_finish !=
      (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
      super__Vector_impl_data._M_start) {
    lVar7 = 0;
    lVar11 = 0;
    lVar10 = 0;
    uVar12 = 0;
    do {
      uVar3 = (ulong)(uint)part;
      if (part == -1) {
        uVar3 = uVar12;
      }
      Imf_3_4::MultiPartInputFile::header((int)in);
      plVar5 = (long *)Imf_3_4::Header::type_abi_cxx11_();
      type._M_dataplus._M_p = (pointer)&type.field_2;
      std::__cxx11::string::_M_construct<char*>((string *)&type,*plVar5,plVar5[1] + *plVar5);
      __n = type._M_string_length;
      iVar6 = (int)uVar3;
      if ((type._M_string_length == DAT_00116500) &&
         ((type._M_string_length == 0 ||
          (iVar4 = bcmp(type._M_dataplus._M_p,Imf_3_4::SCANLINEIMAGE_abi_cxx11_,
                        type._M_string_length), iVar4 == 0)))) {
        Imf_3_4::InputPart::InputPart((InputPart *)&inpart,in,iVar6);
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        initScanLine((partSizeData *)local_178,
                     (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)((long)&(ppVar1->readBuf).scanlinePixelData.
                                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        + lVar10),
                     (FrameBuffer *)((long)&(ppVar1->readBuf).scanlineBuf._map + lVar10),
                     (InputPart *)&inpart,
                     (outHeaders->
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar11);
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(ppVar2->sizeData).isDeep + lVar7) = local_178._32_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).channelCount + lVar7) = local_178._16_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).tileCount + lVar7) = local_178._24_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).rawSize + lVar7) = local_178._0_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).pixelCount + lVar7) = local_178._8_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(ppVar2->sizeData).partType + lVar7),(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if ((reread) &&
           (ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                     super__Vector_impl_data._M_start,
           initScanLine(&local_78,
                        (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         *)((long)&(ppVar1->rereadBuf).scanlinePixelData.
                                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                           + lVar10),
                        (FrameBuffer *)((long)&(ppVar1->rereadBuf).scanlineBuf._map + lVar10),
                        (InputPart *)&inpart,
                        (outHeaders->
                        super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>).
                        _M_impl.super__Vector_impl_data._M_start + lVar11),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_78.partType._M_dataplus._M_p != &local_78.partType.field_2)) {
          operator_delete(local_78.partType._M_dataplus._M_p,
                          local_78.partType.field_2._M_allocated_capacity + 1);
        }
        readScanLine((InputPart *)&inpart,
                     (FrameBuffer *)
                     ((long)&(((parts->super__Vector_base<partData,_std::allocator<partData>_>).
                               _M_impl.super__Vector_impl_data._M_start)->readBuf).scanlineBuf._map
                     + lVar10),
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(((metrics->stats).
                               super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                               super__Vector_impl_data._M_start)->readPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar7));
      }
      else if ((__n == DAT_00116520) &&
              ((__n == 0 ||
               (iVar4 = bcmp(type._M_dataplus._M_p,Imf_3_4::TILEDIMAGE_abi_cxx11_,__n), iVar4 == 0))
              )) {
        Imf_3_4::TiledInputPart::TiledInputPart((TiledInputPart *)&inpart,in,iVar6);
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        initTiled((partSizeData *)local_178,
                  (vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                   *)((long)&(ppVar1->readBuf).tilePixelData.
                             super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                     + lVar10),
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  ((long)&(ppVar1->readBuf).tiledBuf.
                          super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                  + lVar10),(TiledInputPart *)&inpart,
                  (outHeaders->super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>
                  )._M_impl.super__Vector_impl_data._M_start + lVar11);
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(ppVar2->sizeData).isDeep + lVar7) = local_178._32_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).channelCount + lVar7) = local_178._16_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).tileCount + lVar7) = local_178._24_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).rawSize + lVar7) = local_178._0_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).pixelCount + lVar7) = local_178._8_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(ppVar2->sizeData).partType + lVar7),(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if ((reread) &&
           (ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                     super__Vector_impl_data._M_start,
           initTiled(&local_c0,
                     (vector<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                      *)((long)&(ppVar1->rereadBuf).tilePixelData.
                                super__Vector_base<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>,_std::allocator<std::vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>_>_>
                        + lVar10),
                     (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                     ((long)&(ppVar1->rereadBuf).tiledBuf.
                             super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                     + lVar10),(TiledInputPart *)&inpart,
                     (outHeaders->
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar11),
           (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)local_c0.partType._M_dataplus._M_p != &local_c0.partType.field_2)) {
          operator_delete(local_c0.partType._M_dataplus._M_p,
                          local_c0.partType.field_2._M_allocated_capacity + 1);
        }
        readTiled((TiledInputPart *)&inpart,
                  (vector<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_> *)
                  ((long)&(((parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl
                            .super__Vector_impl_data._M_start)->readBuf).tiledBuf.
                          super__Vector_base<Imf_3_4::FrameBuffer,_std::allocator<Imf_3_4::FrameBuffer>_>
                  + lVar10),
                  (vector<double,_std::allocator<double>_> *)
                  ((long)&(((metrics->stats).
                            super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                            super__Vector_impl_data._M_start)->readPerf).
                          super__Vector_base<double,_std::allocator<double>_> + lVar7));
      }
      else if ((__n == DAT_00116540) &&
              ((__n == 0 ||
               (iVar4 = bcmp(type._M_dataplus._M_p,Imf_3_4::DEEPSCANLINE_abi_cxx11_,__n), iVar4 == 0
               )))) {
        Imf_3_4::DeepScanLineInputPart::DeepScanLineInputPart
                  ((DeepScanLineInputPart *)&inpart,in,iVar6);
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        initAndReadDeepScanLine
                  ((partSizeData *)local_178,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)&(ppVar1->readBuf).deepSampleCount.
                           super__Vector_base<int,_std::allocator<int>_> + lVar10),
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)((long)&(ppVar1->readBuf).deepSampleData.
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      + lVar10),
                   (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                    *)((long)&(ppVar1->readBuf).deepSamplePtrs.
                              super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      + lVar10),(DeepFrameBuffer *)((long)&(ppVar1->readBuf).deepbuf._map + lVar10),
                   (DeepScanLineInputPart *)&inpart,(vector<int,_std::allocator<int>_> *)0x0,
                   (outHeaders->
                   super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar11,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(ppVar2->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + lVar7),
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(ppVar2->readPerf).super__Vector_base<double,_std::allocator<double>_> +
                   lVar7));
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(ppVar2->sizeData).isDeep + lVar7) = local_178._32_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).channelCount + lVar7) = local_178._16_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).tileCount + lVar7) = local_178._24_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).rawSize + lVar7) = local_178._0_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).pixelCount + lVar7) = local_178._8_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(ppVar2->sizeData).partType + lVar7),(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if (reread) {
          ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          initAndReadDeepScanLine
                    ((partSizeData *)local_178,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(ppVar1->rereadBuf).deepSampleCount.
                             super__Vector_base<int,_std::allocator<int>_> + lVar10),
                     (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)((long)&(ppVar1->rereadBuf).deepSampleData.
                                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        + lVar10),
                     (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      *)((long)&(ppVar1->rereadBuf).deepSamplePtrs.
                                super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                        + lVar10),
                     (DeepFrameBuffer *)((long)&(ppVar1->rereadBuf).deepbuf._map + lVar10),
                     (DeepScanLineInputPart *)&inpart,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(ppVar1->readBuf).deepSampleCount.
                             super__Vector_base<int,_std::allocator<int>_> + lVar10),
                     (outHeaders->
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar11,
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(ppVar2->countReadPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar7),
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(ppVar2->readPerf).super__Vector_base<double,_std::allocator<double>_>
                     + lVar7));
          ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          *(undefined8 *)((long)&(ppVar2->sizeData).isDeep + lVar7) = local_178._32_8_;
          *(undefined8 *)((long)&(ppVar2->sizeData).channelCount + lVar7) = local_178._16_8_;
          *(undefined8 *)((long)&(ppVar2->sizeData).tileCount + lVar7) = local_178._24_8_;
          *(undefined8 *)((long)&(ppVar2->sizeData).rawSize + lVar7) = local_178._0_8_;
          *(undefined8 *)((long)&(ppVar2->sizeData).pixelCount + lVar7) = local_178._8_8_;
          std::__cxx11::string::operator=
                    ((string *)((long)&(ppVar2->sizeData).partType + lVar7),(string *)&local_150);
          uVar8 = local_140._M_allocated_capacity;
          _Var9._M_p = local_150._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_150._M_p != &local_140) {
LAB_0010c3cc:
            operator_delete(_Var9._M_p,uVar8 + 1);
          }
        }
      }
      else if ((__n == DAT_00116560) &&
              ((__n == 0 ||
               (iVar4 = bcmp(type._M_dataplus._M_p,Imf_3_4::DEEPTILE_abi_cxx11_,__n), iVar4 == 0))))
      {
        Imf_3_4::DeepTiledInputPart::DeepTiledInputPart(&inpart,in,iVar6);
        ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        initAndReadDeepTiled
                  ((partSizeData *)local_178,
                   (vector<int,_std::allocator<int>_> *)
                   ((long)&(ppVar1->readBuf).deepSampleCount.
                           super__Vector_base<int,_std::allocator<int>_> + lVar10),
                   (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                    *)((long)&(ppVar1->readBuf).deepSampleData.
                              super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      + lVar10),
                   (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                    *)((long)&(ppVar1->readBuf).deepSamplePtrs.
                              super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      + lVar10),(DeepFrameBuffer *)((long)&(ppVar1->readBuf).deepbuf._map + lVar10),
                   &inpart,(vector<int,_std::allocator<int>_> *)0x0,
                   (outHeaders->
                   super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                   super__Vector_impl_data._M_start + lVar11,
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(ppVar2->countReadPerf).
                           super__Vector_base<double,_std::allocator<double>_> + lVar7),
                   (vector<double,_std::allocator<double>_> *)
                   ((long)&(ppVar2->readPerf).super__Vector_base<double,_std::allocator<double>_> +
                   lVar7));
        ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>._M_impl.
                 super__Vector_impl_data._M_start;
        *(undefined8 *)((long)&(ppVar2->sizeData).isDeep + lVar7) = local_178._32_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).channelCount + lVar7) = local_178._16_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).tileCount + lVar7) = local_178._24_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).rawSize + lVar7) = local_178._0_8_;
        *(undefined8 *)((long)&(ppVar2->sizeData).pixelCount + lVar7) = local_178._8_8_;
        std::__cxx11::string::operator=
                  ((string *)((long)&(ppVar2->sizeData).partType + lVar7),(string *)&local_150);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_150._M_p != &local_140) {
          operator_delete(local_150._M_p,local_140._M_allocated_capacity + 1);
        }
        if (reread) {
          ppVar1 = (parts->super__Vector_base<partData,_std::allocator<partData>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          ppVar2 = (metrics->stats).super__Vector_base<partStats,_std::allocator<partStats>_>.
                   _M_impl.super__Vector_impl_data._M_start;
          initAndReadDeepTiled
                    (&local_108,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(ppVar1->rereadBuf).deepSampleCount.
                             super__Vector_base<int,_std::allocator<int>_> + lVar10),
                     (vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                      *)((long)&(ppVar1->rereadBuf).deepSampleData.
                                super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                        + lVar10),
                     (vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                      *)((long)&(ppVar1->rereadBuf).deepSamplePtrs.
                                super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                        + lVar10),
                     (DeepFrameBuffer *)((long)&(ppVar1->rereadBuf).deepbuf._map + lVar10),&inpart,
                     (vector<int,_std::allocator<int>_> *)
                     ((long)&(ppVar1->readBuf).deepSampleCount.
                             super__Vector_base<int,_std::allocator<int>_> + lVar10),
                     (outHeaders->
                     super__Vector_base<Imf_3_4::Header,_std::allocator<Imf_3_4::Header>_>)._M_impl.
                     super__Vector_impl_data._M_start + lVar11,
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(ppVar2->countReadPerf).
                             super__Vector_base<double,_std::allocator<double>_> + lVar7),
                     (vector<double,_std::allocator<double>_> *)
                     ((long)&(ppVar2->readPerf).super__Vector_base<double,_std::allocator<double>_>
                     + lVar7));
          uVar8 = local_108.partType.field_2._M_allocated_capacity;
          _Var9._M_p = local_108.partType._M_dataplus._M_p;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_108.partType._M_dataplus._M_p != &local_108.partType.field_2)
          goto LAB_0010c3cc;
        }
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)type._M_dataplus._M_p != &type.field_2) {
        operator_delete(type._M_dataplus._M_p,type.field_2._M_allocated_capacity + 1);
      }
      uVar12 = uVar12 + 1;
      lVar10 = lVar10 + 0x250;
      lVar11 = lVar11 + 0x38;
      lVar7 = lVar7 + 0xc0;
    } while (uVar12 < (ulong)(((long)(parts->super__Vector_base<partData,_std::allocator<partData>_>
                                     )._M_impl.super__Vector_impl_data._M_finish -
                               (long)(parts->super__Vector_base<partData,_std::allocator<partData>_>
                                     )._M_impl.super__Vector_impl_data._M_start >> 4) *
                             0x14c1bacf914c1bad));
  }
  return;
}

Assistant:

void
initAndReadFile (
    MultiPartInputFile&   in,
    const vector<Header>& outHeaders,
    int                   part,
    vector<partData>&     parts,
    fileMetrics&          metrics,
    bool                  reread)
{

    for (size_t p = 0; p < parts.size (); ++p)
    {

        int    readPart = (part == -1 ? p : part);
        string type     = in.header (readPart).type ();

        if (type == SCANLINEIMAGE)
        {
            InputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initScanLine (
                parts[p].readBuf.scanlinePixelData,
                parts[p].readBuf.scanlineBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initScanLine (
                    parts[p].rereadBuf.scanlinePixelData,
                    parts[p].rereadBuf.scanlineBuf,
                    inpart,
                    outHeaders[p]);
            }
            readScanLine (
                inpart,
                parts[p].readBuf.scanlineBuf,
                metrics.stats[p].readPerf);
        }
        else if (type == TILEDIMAGE)
        {
            TiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initTiled (
                parts[p].readBuf.tilePixelData,
                parts[p].readBuf.tiledBuf,
                inpart,
                outHeaders[p]);
            if (reread)
            {
                initTiled (
                    parts[p].rereadBuf.tilePixelData,
                    parts[p].rereadBuf.tiledBuf,
                    inpart,
                    outHeaders[p]);
            }
            readTiled (
                inpart, parts[p].readBuf.tiledBuf, metrics.stats[p].readPerf);
        }
        else if (type == DEEPSCANLINE)
        {
            DeepScanLineInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepScanLine (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);

            if (reread)
            {
                metrics.stats[p].sizeData = initAndReadDeepScanLine (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
        else if (type == DEEPTILE)
        {
            DeepTiledInputPart inpart (in, readPart);
            metrics.stats[p].sizeData = initAndReadDeepTiled (
                parts[p].readBuf.deepSampleCount,
                parts[p].readBuf.deepSampleData,
                parts[p].readBuf.deepSamplePtrs,
                parts[p].readBuf.deepbuf,
                inpart,
                nullptr,
                outHeaders[p],
                metrics.stats[p].countReadPerf,
                metrics.stats[p].readPerf);
            if (reread)
            {
                initAndReadDeepTiled (
                    parts[p].rereadBuf.deepSampleCount,
                    parts[p].rereadBuf.deepSampleData,
                    parts[p].rereadBuf.deepSamplePtrs,
                    parts[p].rereadBuf.deepbuf,
                    inpart,
                    &parts[p].readBuf.deepSampleCount,
                    outHeaders[p],
                    metrics.stats[p].countReadPerf,
                    metrics.stats[p].readPerf);
            }
        }
    }
}